

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rational.cpp
# Opt level: O2

void anon_unknown.dwarf_7f585::test_default_construction<long>(void)

{
  ResultBuilder *pRVar1;
  int local_2ec;
  undefined8 local_2e8;
  SourceLineInfo local_2e0;
  ResultBuilder __catchResult;
  
  Catch::SourceLineInfo::SourceLineInfo
            (&local_2e0,
             "/workspace/llm4binary/github/license_c_cmakelists/tcbrindle[P]rational/test/test_rational.cpp"
             ,0x18);
  Catch::ResultBuilder::ResultBuilder(&__catchResult,"REQUIRE",&local_2e0,"r2.num() == 0",Normal,"")
  ;
  std::__cxx11::string::~string((string *)&local_2e0);
  local_2e8 = 0;
  local_2ec = 0;
  local_2e0.file._M_dataplus._M_p = (pointer)&__catchResult;
  local_2e0.file._M_string_length = (size_type)&local_2e8;
  pRVar1 = Catch::ExpressionLhs<long_const&>::captureExpression<(Catch::Internal::Operator)0,int>
                     ((ExpressionLhs<long_const&> *)&local_2e0,&local_2ec);
  Catch::ResultBuilder::endExpression(pRVar1);
  Catch::ResultBuilder::shouldDebugBreak(&__catchResult);
  Catch::ResultBuilder::react(&__catchResult);
  Catch::ResultBuilder::~ResultBuilder(&__catchResult);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_2e0,
             "/workspace/llm4binary/github/license_c_cmakelists/tcbrindle[P]rational/test/test_rational.cpp"
             ,0x19);
  Catch::ResultBuilder::ResultBuilder
            (&__catchResult,"REQUIRE",&local_2e0,"r2.denom() == 1",Normal,"");
  std::__cxx11::string::~string((string *)&local_2e0);
  local_2e8 = 1;
  local_2ec = 1;
  local_2e0.file._M_dataplus._M_p = (pointer)&__catchResult;
  local_2e0.file._M_string_length = (size_type)&local_2e8;
  pRVar1 = Catch::ExpressionLhs<long_const&>::captureExpression<(Catch::Internal::Operator)0,int>
                     ((ExpressionLhs<long_const&> *)&local_2e0,&local_2ec);
  Catch::ResultBuilder::endExpression(pRVar1);
  Catch::ResultBuilder::shouldDebugBreak(&__catchResult);
  Catch::ResultBuilder::react(&__catchResult);
  Catch::ResultBuilder::~ResultBuilder(&__catchResult);
  return;
}

Assistant:

void test_default_construction()
{
    using rational = tcb::rational<T>;

    constexpr rational r1{};
    static_assert(r1.num() == 0, "");
    static_assert(r1.denom() == 1, "");

    const rational r2{};
    REQUIRE(r2.num() == 0);
    REQUIRE(r2.denom() == 1);
}